

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

void __thiscall
Js::TypedArray<float,_false,_false>::SortHelper
          (TypedArray<float,_false,_false> *this,byte *listBuffer,uint32 length,
          RecyclableObject *compareFn,ScriptContext *scriptContext,ArenaAllocator *allocator)

{
  undefined1 local_40 [8];
  CompareVarsInfo cvInfo;
  
  cvInfo.scriptContext = (ScriptContext *)0x0;
  local_40 = (undefined1  [8])scriptContext;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet
            ((WriteBarrierPtr<Js::RecyclableObject> *)&cvInfo,compareFn);
  cvInfo.compFn.ptr = (RecyclableObject *)TypedArrayCompareElementsHelper<float>;
  JavascriptArray::TypedArraySort<float>
            ((float *)listBuffer,length,(CompareVarsInfo *)local_40,allocator);
  return;
}

Assistant:

void SortHelper(byte* listBuffer, uint32 length, RecyclableObject* compareFn, ScriptContext* scriptContext, ArenaAllocator* allocator)
        {
            TypeName* list = reinterpret_cast<TypeName*>(listBuffer);
            JavascriptArray::CompareVarsInfo cvInfo;
            cvInfo.scriptContext = scriptContext;
            cvInfo.compFn = compareFn;
            cvInfo.compareType = &TypedArrayCompareElementsHelper<TypeName>;
            JavascriptArray::TypedArraySort<TypeName>(list, length, &cvInfo, allocator);
        }